

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall Imf_3_4::Image::Image(Image *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Image = (_func_int **)&PTR__Image_00128b50;
  (this->_dataWindow).min.x = 0;
  (this->_dataWindow).min.y = 0;
  (this->_dataWindow).max.x = -1;
  (this->_dataWindow).max.y = -1;
  p_Var1 = &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
  this->_levelMode = ONE_LEVEL;
  this->_levelRoundingMode = ROUND_DOWN;
  *(undefined8 *)&(this->_channels)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_levels)._sizeX = 0;
  (this->_levels)._sizeY = 0;
  (this->_levels)._data = (ImageLevel **)0x0;
  return;
}

Assistant:

Image::Image ()
    : _dataWindow (Box2i (V2i (0, 0), V2i (-1, -1)))
    , _levelMode (ONE_LEVEL)
    , _levelRoundingMode (ROUND_DOWN)
    , _channels ()
    , _levels ()
{
    // empty
}